

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Huffman.cpp
# Opt level: O0

void __thiscall HuffmanEncoder::build(HuffmanEncoder *this,shared_ptr<HuffmanNode> *root)

{
  bool bVar1;
  element_type *this_00;
  mapped_type *this_01;
  bool local_d9;
  string local_b0 [38];
  char local_8a;
  byte local_89;
  undefined1 local_88 [32];
  undefined1 local_68 [48];
  undefined1 local_38 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  shared_ptr<HuffmanNode> *root_local;
  HuffmanEncoder *this_local;
  
  local_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)root;
  root_local = (shared_ptr<HuffmanNode> *)this;
  std::__shared_ptr_access<HuffmanNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<HuffmanNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)root);
  HuffmanNode::get_left((HuffmanNode *)(local_38 + 0x10));
  bVar1 = std::operator!=((shared_ptr<HuffmanNode> *)(local_38 + 0x10),(nullptr_t)0x0);
  std::shared_ptr<HuffmanNode>::~shared_ptr((shared_ptr<HuffmanNode> *)(local_38 + 0x10));
  if (bVar1) {
    std::__cxx11::string::append((char *)&this->temp_code_);
    std::__shared_ptr_access<HuffmanNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<HuffmanNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               local_18._M_pi);
    HuffmanNode::get_left((HuffmanNode *)local_38);
    build(this,(shared_ptr<HuffmanNode> *)local_38);
    std::shared_ptr<HuffmanNode>::~shared_ptr((shared_ptr<HuffmanNode> *)local_38);
  }
  std::__shared_ptr_access<HuffmanNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<HuffmanNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_18._M_pi);
  HuffmanNode::get_right((HuffmanNode *)(local_68 + 0x10));
  bVar1 = std::operator!=((shared_ptr<HuffmanNode> *)(local_68 + 0x10),(nullptr_t)0x0);
  std::shared_ptr<HuffmanNode>::~shared_ptr((shared_ptr<HuffmanNode> *)(local_68 + 0x10));
  if (bVar1) {
    std::__cxx11::string::append((char *)&this->temp_code_);
    std::__shared_ptr_access<HuffmanNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<HuffmanNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               local_18._M_pi);
    HuffmanNode::get_right((HuffmanNode *)local_68);
    build(this,(shared_ptr<HuffmanNode> *)local_68);
    std::shared_ptr<HuffmanNode>::~shared_ptr((shared_ptr<HuffmanNode> *)local_68);
  }
  std::__shared_ptr_access<HuffmanNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<HuffmanNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_18._M_pi);
  HuffmanNode::get_right((HuffmanNode *)(local_88 + 0x10));
  bVar1 = std::operator==((shared_ptr<HuffmanNode> *)(local_88 + 0x10),(nullptr_t)0x0);
  local_89 = 0;
  local_d9 = false;
  if (bVar1) {
    std::__shared_ptr_access<HuffmanNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<HuffmanNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               local_18._M_pi);
    HuffmanNode::get_left((HuffmanNode *)local_88);
    local_89 = 1;
    local_d9 = std::operator==((shared_ptr<HuffmanNode> *)local_88,(nullptr_t)0x0);
  }
  if ((local_89 & 1) != 0) {
    std::shared_ptr<HuffmanNode>::~shared_ptr((shared_ptr<HuffmanNode> *)local_88);
  }
  std::shared_ptr<HuffmanNode>::~shared_ptr((shared_ptr<HuffmanNode> *)(local_88 + 0x10));
  if (local_d9 != false) {
    this_00 = std::__shared_ptr_access<HuffmanNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<HuffmanNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_18._M_pi);
    local_8a = HuffmanNode::get_c(this_00);
    this_01 = std::
              map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->table_,&local_8a);
    std::__cxx11::string::operator=((string *)this_01,(string *)&this->temp_code_);
  }
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_b0,(ulong)&this->temp_code_);
  std::__cxx11::string::operator=((string *)&this->temp_code_,local_b0);
  std::__cxx11::string::~string(local_b0);
  return;
}

Assistant:

void HuffmanEncoder::build(const shared_ptr<HuffmanNode>& root) {
  if (root->get_left() != nullptr) {
    temp_code_.append("0");
    build(root->get_left());
  }

  if (root->get_right() != nullptr) {
    temp_code_.append("1");
    build(root->get_right());
  }

  if (root->get_right() == nullptr &&
    root->get_left() == nullptr) {
    table_[root->get_c()] = temp_code_;
  }

  temp_code_ = temp_code_.substr(0, temp_code_.size() - 1);
}